

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  deUint32 dVar6;
  RenderTarget *pRVar7;
  ShaderProgramDeclaration *pSVar8;
  int iVar9;
  char *description;
  int y;
  int iVar10;
  int iVar11;
  string *__x;
  int x;
  deUint32 drawIndirectBuf;
  allocator<char> local_5a1;
  allocator<char> local_5a0;
  allocator<char> local_59f;
  allocator<char> local_59e;
  allocator<char> local_59d;
  float local_59c;
  deUint32 indexBuf;
  bool local_594;
  uint local_590;
  uint local_58c;
  uint local_588;
  uint local_584;
  int local_580;
  float local_57c;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  Surface surface;
  deUint32 offsetBuf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  deUint32 colorBuf;
  deUint32 positionBuf;
  deUint32 vaoID;
  deUint16 indices [6];
  DrawElementsCommand command;
  GLContext ctx;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 local_298 [20];
  undefined8 local_284;
  undefined8 uStack_27c;
  float local_274;
  pointer local_270;
  undefined4 local_268;
  float local_264;
  pointer local_260;
  float local_258;
  undefined8 local_254;
  undefined4 local_24c;
  float local_248;
  float local_244;
  pointer local_240;
  GridProgram program;
  
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar11 = pRVar7->m_width;
  if (0x3ff < iVar11) {
    iVar11 = 0x400;
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = 0x400;
  if (pRVar7->m_height < 0x400) {
    iVar9 = pRVar7->m_height;
  }
  program.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  program.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar11;
  program.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = iVar9;
  sglr::GLContext::GLContext
            (&ctx,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&program);
  tcu::Surface::Surface(&surface,iVar11,iVar9);
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"a_position",&local_59d);
  std::__cxx11::string::string((string *)&offsets,(string *)&local_2b8);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     ((ShaderProgramDeclaration *)local_298,(VertexAttribute *)&offsets);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"a_offset",&local_59e);
  std::__cxx11::string::string((string *)&colors,(string *)&local_2d8);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,(VertexAttribute *)&colors);
  std::__cxx11::string::string<std::allocator<char>>((string *)indices,"a_color",&local_59f);
  std::__cxx11::string::string((string *)&command,(string *)indices);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,(VertexAttribute *)&command);
  indexBuf = 0;
  local_594 = false;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     (pSVar8,(VertexToFragmentVarying *)&indexBuf);
  drawIndirectBuf = 0;
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<
                     (pSVar8,(FragmentOutput *)&drawIndirectBuf);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionBuf,
             "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
             ,&local_5a0);
  std::__cxx11::string::string((string *)&vaoID,(string *)&positionBuf);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,(VertexSource *)&vaoID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorBuf,
             "#version 310 es\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nin highp vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,&local_5a1);
  std::__cxx11::string::string((string *)&offsetBuf,(string *)&colorBuf);
  pSVar8 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar8,(FragmentSource *)&offsetBuf);
  sglr::ShaderProgram::ShaderProgram(&program.super_ShaderProgram,pSVar8);
  std::__cxx11::string::~string((string *)&offsetBuf);
  std::__cxx11::string::~string((string *)&colorBuf);
  std::__cxx11::string::~string((string *)&vaoID);
  std::__cxx11::string::~string((string *)&positionBuf);
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&colors);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&offsets);
  std::__cxx11::string::~string((string *)&local_2b8);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  program.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00a08ab8;
  vaoID = 0;
  program.super_ShaderProgram.super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00a08af0;
  positionBuf = 0;
  offsetBuf = 0;
  program.super_ShaderProgram.super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00a08b08;
  colorBuf = 0;
  indexBuf = 0;
  local_2b8 = 0x3f80000000000000;
  uStack_2b0 = 0x3f80000000000000;
  drawIndirectBuf = 0;
  local_2d8 = 0x3f800000;
  uStack_2d4 = 0x3f800000;
  uStack_2d0 = 0;
  uStack_2cc = 0x3f800000;
  uVar5 = (*ctx.super_Context._vptr_Context[0x75])();
  local_584 = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar5,"a_position");
  local_588 = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar5,"a_offset");
  local_58c = (*ctx.super_Context._vptr_Context[0x59])(&ctx,(ulong)uVar5,"a_color");
  iVar11 = this->m_gridSide;
  local_59c = 2.0 / (float)iVar11;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x3f80000000000000;
  local_284 = 0;
  uStack_27c = 0x3f800000;
  local_270 = (pointer)0x3f80000000000000;
  local_268 = 0;
  local_260 = (pointer)0x3f80000000000000;
  local_254 = 0;
  local_24c = 0x3f800000;
  local_240 = (pointer)0x3f80000000000000;
  indices[0] = 0;
  indices[1] = 4;
  indices[2] = 3;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 5;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = 0;
  local_590 = uVar5;
  local_298._16_4_ = local_59c;
  local_274 = local_59c;
  local_264 = local_59c;
  local_258 = local_59c;
  local_248 = local_59c;
  local_244 = local_59c;
  while (iVar9 < iVar11) {
    local_57c = (float)iVar9 * local_59c + -1.0;
    local_580 = iVar9;
    for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
      colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44((float)iVar10 * local_59c + -1.0,local_57c);
      colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
      emplace_back<tcu::Vector<float,4>>
                ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&offsets,
                 (Vector<float,_4> *)&colors);
      iVar11 = this->m_gridSide;
    }
    iVar9 = local_580 + 1;
  }
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar9 = 0; iVar9 < iVar11; iVar9 = iVar9 + 1) {
    for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
      __x = (string *)&local_2d8;
      if ((iVar9 + iVar10 & 1U) == 0) {
        __x = (string *)&local_2b8;
      }
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                (&colors,(value_type *)__x);
      iVar11 = this->m_gridSide;
    }
  }
  (*ctx.super_Context._vptr_Context[0x4c])(&ctx,1,&vaoID);
  uVar3 = local_584;
  uVar2 = local_588;
  uVar1 = local_58c;
  uVar5 = local_590;
  (*ctx.super_Context._vptr_Context[0x4b])(&ctx,(ulong)vaoID);
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&positionBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)positionBuf);
  (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8892,0x60,local_298,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar3,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar3,0);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar3);
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&offsetBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)offsetBuf);
  (*ctx.super_Context._vptr_Context[0x28])
            (&ctx,0x8892,
             (long)offsets.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)offsets.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             offsets.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar2,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar2,1);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar2);
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&colorBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8892,(ulong)colorBuf);
  (*ctx.super_Context._vptr_Context[0x28])
            (&ctx,0x8892,
             (long)colors.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)colors.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             colors.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  (*ctx.super_Context._vptr_Context[0x4e])(&ctx,(ulong)uVar1,4,0x1406,0,0,0);
  (*ctx.super_Context._vptr_Context[0x52])(&ctx,(ulong)uVar1,1);
  (*ctx.super_Context._vptr_Context[0x50])(&ctx,(ulong)uVar1);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&indexBuf);
    (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8893,(ulong)indexBuf);
    (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8893,0xc,indices,0x88e4);
  }
  (*ctx.super_Context._vptr_Context[0x26])(&ctx,1,&drawIndirectBuf);
  (*ctx.super_Context._vptr_Context[0x25])(&ctx,0x8f3f,(ulong)drawIndirectBuf);
  if (this->m_useIndices == true) {
    command.count = 6;
    command.primCount = this->m_gridSide * this->m_gridSide;
    command.firstIndex = 0;
    command.baseVertex = 0;
    command.reservedMustBeZero = 0;
    (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8f3f,0x14,&command,0x88e4);
  }
  else {
    command.count = 6;
    command.primCount = this->m_gridSide * this->m_gridSide;
    command.firstIndex = 0;
    command.baseVertex = 0;
    (*ctx.super_Context._vptr_Context[0x28])(&ctx,0x8f3f,0x10,&command,0x88e4);
  }
  (*ctx.super_Context._vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*ctx.super_Context._vptr_Context[0x2d])(&ctx,0x4000);
  (*ctx.super_Context._vptr_Context[5])
            (&ctx,0,0,(ulong)(uint)surface.m_width,(ulong)(uint)surface.m_height);
  (*ctx.super_Context._vptr_Context[0x76])(&ctx,(ulong)uVar5);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x71])(&ctx,4,0x1403,0);
  }
  else {
    (*ctx.super_Context._vptr_Context[0x70])(&ctx,4,0);
  }
  (*ctx.super_Context._vptr_Context[0x76])(&ctx,0);
  dVar6 = (*ctx.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar6,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x398);
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&drawIndirectBuf);
  if (this->m_useIndices == true) {
    (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&indexBuf);
  }
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&colorBuf);
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&offsetBuf);
  (*ctx.super_Context._vptr_Context[0x27])(&ctx,1,&positionBuf);
  (*ctx.super_Context._vptr_Context[0x4d])(&ctx,1,&vaoID);
  (*ctx.super_Context._vptr_Context[0x77])(&ctx,(ulong)uVar5);
  (*ctx.super_Context._vptr_Context[0x7a])();
  (*ctx.super_Context._vptr_Context[0x80])
            (&ctx,&surface,0,0,(ulong)(uint)surface.m_width,(ulong)(uint)surface.m_height);
  dVar6 = (*ctx.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar6,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x3a6);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&offsets.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  bVar4 = verifyImageYellowGreen
                    (&surface,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log);
  description = "Result image invalid";
  if (bVar4) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar4,description
            );
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  tcu::Surface::~Surface(&surface);
  sglr::GLContext::~GLContext(&ctx);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all instances were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}